

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

void CB_ADF::learn_SM(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  label *cs_labels;
  action_scores *this;
  v_array<unsigned_int> *this_00;
  uint uVar1;
  pointer ppeVar2;
  float *pfVar3;
  wclass *pwVar4;
  action_score *paVar5;
  example *peVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint32_t chosen_action;
  cb_adf *pcVar12;
  float fVar13;
  float local_c4;
  action_score local_c0;
  cb_adf *local_b8;
  v_array<ACTION_SCORE::action_score> *local_b0;
  undefined1 local_a8 [16];
  v_array<CB::label> *local_98;
  v_array<COST_SENSITIVE::label> *local_90;
  multi_learner *local_88;
  label *local_80;
  double local_78;
  score_iterator local_70;
  score_iterator local_60;
  score_iterator local_50;
  score_iterator local_40;
  
  cs_labels = &mydata->cs_labels;
  GEN_CS::gen_cs_test_example(examples,cs_labels);
  local_98 = &mydata->cb_labels;
  local_90 = &mydata->prepped_cs_labels;
  local_88 = base;
  GEN_CS::call_cs_ldf<false>(base,examples,local_98,cs_labels,local_90,mydata->offset,0);
  this = &mydata->a_s;
  v_array<ACTION_SCORE::action_score>::clear(this);
  local_b0 = &mydata->prob_s;
  local_b8 = mydata;
  v_array<ACTION_SCORE::action_score>::clear(local_b0);
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pfVar3 = ((*ppeVar2)->pred).scalars._begin;
    if ((ulong)((long)((*ppeVar2)->pred).scalars._end - (long)pfVar3 >> 3) <= uVar10) break;
    local_c0.action = (uint32_t)pfVar3[uVar10 * 2];
    local_c0.score = ((*ppeVar2)->pred).a_s._begin[uVar10].score;
    v_array<ACTION_SCORE::action_score>::push_back(this,&local_c0);
    local_c0.action =
         (uint32_t)
         ((*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start)->pred).scalars._begin[uVar10 * 2];
    local_c0.score = 0.0;
    v_array<ACTION_SCORE::action_score>::push_back(local_b0,&local_c0);
    uVar9 = uVar9 + 1;
  }
  uVar10 = 0;
  while (chosen_action = (uint32_t)uVar10,
        uVar10 < (ulong)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar2 >> 3)) {
    pwVar4 = (ppeVar2[uVar10]->l).cs.costs._begin;
    if ((long)(ppeVar2[uVar10]->l).cs.costs._end - (long)pwVar4 == 0x10) {
      fVar13 = pwVar4->x;
      if ((fVar13 != 3.4028235e+38) || (NAN(fVar13))) {
        local_a8 = ZEXT416((uint)fVar13);
        local_c4 = GEN_CS::safe_probability(pwVar4->partial_prediction);
        bVar7 = pwVar4->x != 0.0;
        bVar8 = pwVar4->x <= 0.0;
        local_c4 = (float)local_a8._0_4_ / local_c4;
        if (bVar8 && bVar7) {
          local_c4 = -local_c4;
        }
        fVar13 = *(float *)(&DAT_00240f00 + (ulong)(bVar8 && bVar7) * 4);
        goto LAB_002173c5;
      }
    }
    uVar10 = (ulong)(chosen_action + 1);
  }
  chosen_action = 0;
  local_c4 = 1.0;
  fVar13 = 1.0;
LAB_002173c5:
  pcVar12 = local_b8;
  GEN_CS::gen_cs_example_sm(examples,chosen_action,fVar13,*this,cs_labels);
  local_40._p = (pcVar12->a_s)._begin;
  local_40._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_50._p = (pcVar12->a_s)._end;
  local_50._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_60._p = (pcVar12->prob_s)._begin;
  local_60._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_70._p = (pcVar12->prob_s)._end;
  local_70._vptr_score_iterator =
       (_func_int **)
       &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            (-1.0,&local_40,&local_50,&local_60,&local_70);
  paVar5 = (pcVar12->prob_s)._begin;
  uVar10 = 0;
  do {
    uVar11 = uVar10;
    if ((ulong)((long)(pcVar12->prob_s)._end - (long)paVar5 >> 3) <= uVar11) goto LAB_00217485;
    uVar10 = (ulong)((int)uVar11 + 1);
  } while (paVar5[uVar11].action != chosen_action);
  local_c4 = local_c4 * paVar5[uVar11].score;
LAB_00217485:
  this_00 = &pcVar12->backup_weights;
  local_80 = cs_labels;
  v_array<unsigned_int>::clear(this_00);
  local_a8._0_8_ = &pcVar12->backup_nf;
  v_array<unsigned_int>::clear(&pcVar12->backup_nf);
  local_78 = (double)local_c4;
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    paVar5 = (pcVar12->prob_s)._begin;
    if ((ulong)((long)(pcVar12->prob_s)._end - (long)paVar5 >> 3) <= uVar10) break;
    uVar1 = paVar5[uVar10].action;
    local_c0.action =
         (uint32_t)
         (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar1]->weight;
    v_array<unsigned_int>::push_back(this_00,&local_c0.action);
    local_c0.action =
         *(uint32_t *)
          &(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar1]->num_features;
    v_array<unsigned_int>::push_back((v_array<unsigned_int> *)local_a8._0_8_,&local_c0.action);
    fVar13 = local_b0->_begin[uVar10].score;
    if (uVar1 == chosen_action) {
      fVar13 = (float)((1.0 - (double)fVar13) * local_78);
    }
    else {
      fVar13 = fVar13 * local_c4;
    }
    (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1]->weight = fVar13;
    peVar6 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar1];
    if (peVar6->weight <= 1e-15) {
      peVar6->weight = 0.0;
    }
    uVar9 = uVar9 + 1;
    pcVar12 = local_b8;
  }
  GEN_CS::call_cs_ldf<true>(local_88,examples,local_98,local_80,local_90,pcVar12->offset,0);
  uVar9 = 0;
  while( true ) {
    uVar10 = (ulong)uVar9;
    paVar5 = (pcVar12->prob_s)._begin;
    if ((ulong)((long)(pcVar12->prob_s)._end - (long)paVar5 >> 3) <= uVar10) break;
    uVar1 = paVar5[uVar10].action;
    (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1]->weight = (float)this_00->_begin[uVar10];
    (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar1]->num_features =
         (ulong)*(uint *)(*(long *)local_a8._0_8_ + uVar10 * 4);
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void learn_SM(cb_adf& mydata, multi_learner& base, multi_ex& examples) {
  gen_cs_test_example(examples, mydata.cs_labels);  // create test labels.
  call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  // Can probably do this more efficiently than 6 loops over the examples...
  //[1: initialize temporary storage;
  // 2: find chosen action;
  // 3: create cs_labels (gen_cs_example_sm);
  // 4: get probability of chosen action;
  // 5: backup example wts;
  // 6: restore example wts]
  mydata.a_s.clear();
  mydata.prob_s.clear();
  // TODO: Check that predicted scores are always stored with the first example
  for (uint32_t i = 0; i < examples[0]->pred.a_s.size(); i++)
  {
    mydata.a_s.push_back({examples[0]->pred.a_s[i].action, examples[0]->pred.a_s[i].score});
    mydata.prob_s.push_back({examples[0]->pred.a_s[i].action, 0.0});
  }

  float sign_offset = 1.0;    // To account for negative rewards/costs
  uint32_t chosen_action = 0;
  float example_weight = 1.0;

  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      chosen_action = i;
      example_weight = ld.costs[0].cost / safe_probability(ld.costs[0].probability);

      // Importance weights of examples cannot be negative.
      // So we use a trick: set |w| as weight, and use sign(w) as an offset in the regression target.
      if (ld.costs[0].cost < 0.0)
      {
        sign_offset = -1.0;
        example_weight = -example_weight;
      }
      break;
    }
  }

  gen_cs_example_sm(examples, chosen_action, sign_offset, mydata.a_s, mydata.cs_labels);

  // Lambda is -1 in the call to generate_softmax because in vw, lower score is better; for softmax higher score is better.
  generate_softmax(-1.0, begin_scores(mydata.a_s), end_scores(mydata.a_s), begin_scores(mydata.prob_s), end_scores(mydata.prob_s));

  // TODO: Check Marco's example that causes VW to report prob > 1.

  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)  // Scale example_wt by prob of chosen action
  {
    if (mydata.prob_s[i].action == chosen_action)
    {
      example_weight *= mydata.prob_s[i].score;
      break;
    }
  }

  mydata.backup_weights.clear();
  mydata.backup_nf.clear();
    for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    mydata.backup_weights.push_back(examples[current_action]->weight);
    mydata.backup_nf.push_back(examples[current_action]->num_features);

    if (current_action == chosen_action)
      examples[current_action]->weight = example_weight * (1.0 - mydata.prob_s[i].score);
    else
      examples[current_action]->weight = example_weight * mydata.prob_s[i].score;

    if (examples[current_action]->weight <= 1e-15)
      examples[current_action]->weight = 0;
  }

  //Do actual training
  call_cs_ldf<true>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  //Restore example weights and numFeatures
  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    examples[current_action]->weight = mydata.backup_weights[i];
    examples[current_action]->num_features = mydata.backup_nf[i];
  }
}